

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_can_have_alpha(LodePNGColorMode *info)

{
  long lVar1;
  size_t sVar2;
  
  if ((info->key_defined == 0) && ((info->colortype & LCT_GREY_ALPHA) == LCT_GREY)) {
    sVar2 = 0;
    do {
      if (info->palettesize == sVar2) {
        return 0;
      }
      lVar1 = sVar2 * 4;
      sVar2 = sVar2 + 1;
    } while (info->palette[lVar1 + 3] == 0xff);
    return 1;
  }
  return 1;
}

Assistant:

unsigned lodepng_can_have_alpha(const LodePNGColorMode* info)
{
	return info->key_defined
		|| lodepng_is_alpha_type(info)
		|| lodepng_has_palette_alpha(info);
}